

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketContextData.h
# Opt level: O0

void __thiscall
uWS::WebSocketContextData<false>::WebSocketContextData(WebSocketContextData<false> *this)

{
  TopicTree *in_RDI;
  nullptr_t in_stack_ffffffffffffff08;
  function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<false,_true>_*,_std::basic_string_view<char,_std::char_traits<char>_>,_uWS::OpCode)>_>
  *in_stack_ffffffffffffff10;
  function<int_(uWS::Subscriber_*,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>)>
  *this_00;
  Topic **key;
  Loop *this_01;
  function<int_(uWS::Subscriber_*,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>)>
  *cb;
  function<int_(uWS::Subscriber_*,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>)>
  local_38;
  
  fu2::abi_400::detail::
  function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<false,_true>_*,_std::basic_string_view<char,_std::char_traits<char>_>,_uWS::OpCode)>_>
  ::function(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  fu2::abi_400::detail::
  function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<false,_true>_*)>_>
  ::function((function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<false,_true>_*)>_>
              *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  cb = (function<int_(uWS::Subscriber_*,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>)>
        *)(in_RDI->triggeredTopics + 2);
  fu2::abi_400::detail::
  function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<false,_true>_*,_int,_std::basic_string_view<char,_std::char_traits<char>_>)>_>
  ::function((function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<false,_true>_*,_int,_std::basic_string_view<char,_std::char_traits<char>_>)>_>
              *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  this_01 = (Loop *)(in_RDI->triggeredTopics + 6);
  fu2::abi_400::detail::
  function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<false,_true>_*)>_>
  ::function((function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<false,_true>_*)>_>
              *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  key = in_RDI->triggeredTopics + 10;
  fu2::abi_400::detail::
  function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<false,_true>_*)>_>
  ::function((function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<false,_true>_*)>_>
              *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  in_RDI->triggeredTopics[0xe] = (Topic *)0x0;
  *(undefined4 *)(in_RDI->triggeredTopics + 0xf) = 0;
  in_RDI->triggeredTopics[0x10] = (Topic *)0x0;
  this_00 = &local_38;
  std::
  function<int(uWS::Subscriber*,std::pair<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>)>
  ::
  function<uWS::WebSocketContextData<false>::WebSocketContextData()::_lambda(uWS::Subscriber*,std::pair<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>)_1_,void>
            (this_00,(anon_class_8_1_8991fb9c *)(in_RDI->triggeredTopics + 0x11));
  TopicTree::TopicTree(in_RDI,cb);
  std::
  function<int_(uWS::Subscriber_*,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>)>
  ::~function((function<int_(uWS::Subscriber_*,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>)>
               *)0x245ddb);
  Loop::get(this_00);
  fu2::abi_400::detail::
  function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::Loop_*)>_>
  ::
  function<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]typing_battles_incppect_third_party_uWebSockets_src_WebSocketContextData_h:92:43),_nullptr,_nullptr,_nullptr,_nullptr>
            ((function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::Loop_*)>_>
              *)in_RDI,(anon_class_8_1_8991fb9c_for_value_ *)cb);
  Loop::addPostHandler(this_01,key,(unique_function<void_(Loop_*)> *)this_00);
  fu2::abi_400::detail::
  function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::Loop_*)>_>
  ::~function((function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::Loop_*)>_>
               *)0x245e35);
  Loop::get(this_00);
  fu2::abi_400::detail::
  function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::Loop_*)>_>
  ::
  function<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]typing_battles_incppect_third_party_uWebSockets_src_WebSocketContextData_h:97:42),_nullptr,_nullptr,_nullptr,_nullptr>
            ((function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::Loop_*)>_>
              *)in_RDI,(anon_class_8_1_8991fb9c_for_value_ *)cb);
  Loop::addPreHandler(this_01,key,(unique_function<void_(Loop_*)> *)this_00);
  fu2::abi_400::detail::
  function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::Loop_*)>_>
  ::~function((function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::Loop_*)>_>
               *)0x245e7e);
  return;
}

Assistant:

WebSocketContextData() : topicTree([this](Subscriber *s, std::pair<std::string_view, std::string_view> data) -> int {
        /* We rely on writing to regular asyncSockets */
        auto *asyncSocket = (AsyncSocket<SSL> *) s->user;

        /* Check if we now have too much backpressure (todo: don't buffer up before check) */
        if (!maxBackpressure || (unsigned int) asyncSocket->getBufferedAmount() < maxBackpressure) {
            /* Pick uncompressed data track */
            std::string_view selectedData = data.first;

            /* Are we using compression? Fine, pick the compressed data track */
            WebSocketData *webSocketData = (WebSocketData *) asyncSocket->getAsyncSocketData();
            if (webSocketData->compressionStatus != WebSocketData::CompressionStatus::DISABLED) {
                selectedData = data.second;
            }

            /* Note: this assumes we are not corked, as corking will swallow things and fail later on */
            auto [written, failed] = asyncSocket->write(selectedData.data(), (int) selectedData.length());
            if (!failed) {
                asyncSocket->timeout(this->idleTimeout);
            }
            
            /* Failing here must not immediately close the socket, as that could result in stack overflow,
             * iterator invalidation and other TopicTree::drain bugs. We may shutdown the reading side of the socket,
             * causing next iteration to error-close the socket from that context instead, if we want to */
        }
        
        /* If we have too much backpressure, simply skip sending from here */

        /* Reserved, unused */
        return 0;
    }) {
        /* We empty for both pre and post just to make sure */
        Loop::get()->addPostHandler(this, [this](Loop *loop) {
            /* Commit pub/sub batches every loop iteration */
            topicTree.drain();
        });

        Loop::get()->addPreHandler(this, [this](Loop *loop) {
            /* Commit pub/sub batches every loop iteration */
            topicTree.drain();
        });
    }